

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_BeginReleaseRPC(FACTSoundInstance *sound,uint16_t releaseMS)

{
  uint32_t uVar1;
  short in_SI;
  long in_RDI;
  uint6 in_stack_fffffffffffffff0;
  
  if (in_SI == 0) {
    FACT_INTERNAL_DestroySound((FACTSoundInstance *)(ulong)in_stack_fffffffffffffff0);
  }
  else {
    *(undefined1 *)(in_RDI + 0x2a) = 3;
    uVar1 = FAudio_timems();
    *(uint32_t *)(in_RDI + 0x24) = uVar1;
    *(short *)(in_RDI + 0x28) = in_SI;
    *(uint *)(*(long *)(in_RDI + 0x30) + 0x3c) = *(uint *)(*(long *)(in_RDI + 0x30) + 0x3c) | 0x10;
  }
  return;
}

Assistant:

void FACT_INTERNAL_BeginReleaseRPC(FACTSoundInstance *sound, uint16_t releaseMS)
{
	if (releaseMS == 0)
	{
		/* No release RPC? Screw it, just delete us */
		FACT_INTERNAL_DestroySound(sound);
		return;
	}

	sound->fadeType = 3; /* Release RPC */
	sound->fadeStart = FAudio_timems();
	sound->fadeTarget = releaseMS;

	sound->parentCue->state |= FACT_STATE_STOPPING;
}